

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::PrepareOutputBuffer(FunctionalTest *this)

{
  GLuint *pGVar1;
  ostringstream *this_00;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 *puVar5;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pGVar1 = &this->m_bo_out;
  (**(code **)(lVar4 + 0x6c8))(1,pGVar1);
  iVar2 = (**(code **)(lVar4 + 0x800))();
  if (iVar2 == 0) {
    (**(code **)(lVar4 + 0x40))(0x8c8e,*pGVar1);
    iVar2 = (**(code **)(lVar4 + 0x800))();
    if (iVar2 == 0) {
      (*this->m_pNamedBufferData)(this->m_bo_out,0x1c,s_initial_data_b,0x88ea);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 == 0) {
        (**(code **)(lVar4 + 0x50))(0x8c8e,0,*pGVar1,0,0x18);
        iVar3 = (**(code **)(lVar4 + 0x800))();
        if (iVar3 != 0) {
          local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1a0 + 8),"BindBufferRange has failed.",0x1b);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00a92d8f;
        }
      }
      else {
        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"NamedBufferData has failed.",0x1b);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_128);
      }
      return iVar2 == 0;
    }
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),"BindBuffer has failed.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),"GenBuffers has failed.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
LAB_00a92d8f:
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1a0);
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

bool FunctionalTest::PrepareOutputBuffer()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Buffer preparation */
	gl.genBuffers(1, &m_bo_out);

	if (GL_NO_ERROR == gl.getError())
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_out);

		if (GL_NO_ERROR == gl.getError())
		{
			m_pNamedBufferData(m_bo_out, sizeof(s_initial_data_b), s_initial_data_b, GL_DYNAMIC_COPY);

			if (GL_NO_ERROR == gl.getError())
			{
				gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_out, 0,
								   sizeof(s_initial_data_a) /* intentionally sizeof(a) < sizeof(b) */);

				if (GL_NO_ERROR == gl.getError())
				{
					return true;
				}
				else
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "BindBufferRange has failed."
														<< tcu::TestLog::EndMessage;
					throw 0; /* This function is not being tested, throw test internal error */
				}
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "NamedBufferData has failed."
													<< tcu::TestLog::EndMessage;
			}
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "BindBuffer has failed."
												<< tcu::TestLog::EndMessage;
			throw 0; /* This function is not being tested, throw test internal error */
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GenBuffers has failed."
											<< tcu::TestLog::EndMessage;
		throw 0; /* This function is not being tested, throw test internal error */
	}

	return false;
}